

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O1

string * __thiscall CJSON::EscapeString(string *__return_storage_ptr__,CJSON *this,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  char *__s;
  long *plVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  long *plVar12;
  uint uVar13;
  byte *pbVar14;
  char cVar15;
  ulong uVar16;
  string *psVar17;
  ulong uVar18;
  uint8_t Buf [4];
  string Encode;
  byte abStack_1f8 [88];
  long *local_1a0 [2];
  long local_190 [2];
  undefined8 local_180;
  undefined8 local_178;
  long local_170;
  long local_168 [2];
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  long lStack_120;
  long *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  long lStack_100;
  long *local_f8;
  undefined8 local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  long lStack_e0;
  long *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  long lStack_a0;
  long *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long lStack_80;
  long *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  long lStack_60;
  long *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  long lStack_40;
  string *local_38;
  
  pcVar3 = (str->_M_dataplus)._M_p;
  local_180 = str;
  local_58 = (long *)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + str->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\\","");
  local_178 = local_168;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\\\","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_58,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_58,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_58);
      std::__cxx11::string::replace((ulong)&local_58,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_58 == (long *)&local_48) {
    lStack_140 = lStack_40;
    local_158 = &local_148;
  }
  else {
    local_158 = local_58;
  }
  local_148 = CONCAT71(uStack_47,local_48);
  local_150 = local_50;
  local_50 = 0;
  local_48 = 0;
  local_58 = (long *)&local_48;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_58 != (long *)&local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_78 = (long *)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\"","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\\"","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_78,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_78,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_78);
      std::__cxx11::string::replace((ulong)&local_78,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_78 == (long *)&local_68) {
    lStack_140 = lStack_60;
    local_158 = &local_148;
  }
  else {
    local_158 = local_78;
  }
  local_148 = CONCAT71(uStack_67,local_68);
  local_150 = local_70;
  local_70 = 0;
  local_68 = 0;
  local_78 = (long *)&local_68;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78 != (long *)&local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_98 = (long *)&local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"/","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\/","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_98,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_98,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_98);
      std::__cxx11::string::replace((ulong)&local_98,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_98 == (long *)&local_88) {
    lStack_140 = lStack_80;
    local_158 = &local_148;
  }
  else {
    local_158 = local_98;
  }
  local_148 = CONCAT71(uStack_87,local_88);
  local_150 = local_90;
  local_90 = 0;
  local_88 = 0;
  local_98 = (long *)&local_88;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_98 != (long *)&local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_b8 = (long *)&local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\b","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\b","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_b8,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_b8,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_b8);
      std::__cxx11::string::replace((ulong)&local_b8,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_b8 == (long *)&local_a8) {
    lStack_140 = lStack_a0;
    local_158 = &local_148;
  }
  else {
    local_158 = local_b8;
  }
  local_148 = CONCAT71(uStack_a7,local_a8);
  local_150 = local_b0;
  local_b0 = 0;
  local_a8 = 0;
  local_b8 = (long *)&local_a8;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_b8 != (long *)&local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_d8 = (long *)&local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\n","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\n","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_d8,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_d8,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_d8);
      std::__cxx11::string::replace((ulong)&local_d8,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_d8 == (long *)&local_c8) {
    lStack_140 = lStack_c0;
    local_158 = &local_148;
  }
  else {
    local_158 = local_d8;
  }
  local_148 = CONCAT71(uStack_c7,local_c8);
  local_150 = local_d0;
  local_d0 = 0;
  local_c8 = 0;
  local_d8 = (long *)&local_c8;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_d8 != (long *)&local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_f8 = (long *)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\f","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\f","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_f8,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_f8,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_f8);
      std::__cxx11::string::replace((ulong)&local_f8,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_f8 == (long *)&local_e8) {
    lStack_140 = lStack_e0;
    local_158 = &local_148;
  }
  else {
    local_158 = local_f8;
  }
  local_148 = CONCAT71(uStack_e7,local_e8);
  local_150 = local_f0;
  local_f0 = 0;
  local_e8 = 0;
  local_f8 = (long *)&local_e8;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_f8 != (long *)&local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_118 = (long *)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\r","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\r","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_118,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_118,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_118);
      std::__cxx11::string::replace((ulong)&local_118,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_118 == (long *)&local_108) {
    lStack_140 = lStack_100;
    local_158 = &local_148;
  }
  else {
    local_158 = local_118;
  }
  local_148 = CONCAT71(uStack_107,local_108);
  local_150 = local_110;
  local_110 = 0;
  local_108 = 0;
  local_118 = (long *)&local_108;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_118 != (long *)&local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  pcVar3 = (local_180->_M_dataplus)._M_p;
  local_138 = (long *)&local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar3,pcVar3 + local_180->_M_string_length);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"\t","");
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"\\t","");
  uVar7 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)&local_138,(ulong)local_1a0[0],uVar7);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::erase((ulong)&local_138,uVar7);
      std::__cxx11::string::_M_assign((string *)&local_138);
      std::__cxx11::string::replace((ulong)&local_138,uVar7,(char *)0x0,(ulong)local_178);
      uVar7 = uVar7 + local_170;
    }
  } while (uVar7 != 0xffffffffffffffff);
  if (local_138 == (long *)&local_128) {
    lStack_140 = lStack_120;
    local_158 = &local_148;
  }
  else {
    local_158 = local_138;
  }
  local_148 = CONCAT71(uStack_127,local_128);
  local_150 = local_130;
  local_130 = 0;
  local_128 = 0;
  local_138 = (long *)&local_128;
  std::__cxx11::string::operator=((string *)local_180,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  psVar17 = local_180;
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_138 != (long *)&local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  uVar7 = psVar17->_M_string_length;
  if (uVar7 != 0) {
    uVar18 = 0;
    do {
      pcVar3 = (psVar17->_M_dataplus)._M_p;
      bVar6 = pcVar3[uVar18];
      uVar16 = 3;
      if ((bVar6 & 0xf0) != 0xf0) {
        uVar16 = 2;
        if ((~bVar6 & 0xe0) != 0) {
          uVar16 = (ulong)((~bVar6 & 0xc0) == 0);
        }
      }
      if ((int)uVar16 != 0) {
        bVar9 = 5;
        if ((bVar6 & 0xf0) != 0xf0) {
          bVar9 = 4;
          if (((~bVar6 & 0xe0) != 0) && (bVar9 = 3, (~bVar6 & 0xc0) != 0)) {
            bVar9 = bVar6 >> 6 & 0xfe;
          }
        }
        local_178 = (long *)((ulong)local_178 & 0xffffffff00000000);
        *(byte *)((long)&local_178 + uVar16) = bVar6 & (byte)(0xff >> bVar9);
        pbVar14 = (byte *)((long)&local_180 + uVar16 + 7);
        uVar11 = 0;
        do {
          if ((uVar7 <= uVar18 + uVar11 + 1) ||
             (bVar6 = pcVar3[uVar11 + uVar18 + 1], -0x41 < (char)bVar6)) break;
          *pbVar14 = bVar6 & 0x3f;
          uVar11 = uVar11 + 1;
          pbVar14 = pbVar14 + -1;
        } while (uVar16 + (uVar16 == 0) != uVar11);
        if (uVar11 == uVar16) {
          bVar6 = 6;
          iVar10 = 0;
          cVar15 = '\0';
          uVar13 = 0;
          do {
            sVar2 = ((string *)&local_178)[(long)iVar10 + 1];
            bVar9 = (char)iVar10 * '\x02';
            uVar13 = uVar13 | ((uint)((char)(4 << (bVar9 & 0x1f)) - 1U & (byte)sVar2) <<
                               (bVar6 & 0x1f) | (uint)*(byte *)((long)&local_178 + (long)cVar15)) <<
                              ((char)iVar10 * '\b' & 0x1fU);
            ((string *)&local_178)[(long)iVar10 + 1] = (string)((byte)sVar2 >> (bVar9 + 2 & 0x1f));
            bVar6 = bVar6 - 2;
            cVar15 = cVar15 + '\x01';
            iVar10 = (int)cVar15;
          } while (iVar10 < (int)uVar16);
          bVar6 = *(byte *)((long)&local_178 + uVar16);
          __s = (char *)operator_new__(5);
          iVar10 = snprintf(__s,5,"%0*x",4,(ulong)((uint)bVar6 << (char)uVar16 * '\b' | uVar13));
          local_1a0[0] = local_190;
          std::__cxx11::string::_M_construct<char*>((string *)local_1a0,__s,__s + iVar10);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1a0,0,(char *)0x0,0x135e54);
          psVar17 = local_180;
          local_158 = &local_148;
          plVar12 = plVar8 + 2;
          if ((long *)*plVar8 == plVar12) {
            local_148 = *plVar12;
            lStack_140 = plVar8[3];
          }
          else {
            local_148 = *plVar12;
            local_158 = (long *)*plVar8;
          }
          local_150 = plVar8[1];
          *plVar8 = (long)plVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_1a0[0] != local_190) {
            operator_delete(local_1a0[0],local_190[0] + 1);
          }
          std::__cxx11::string::erase((ulong)psVar17,uVar18);
          std::__cxx11::string::replace((ulong)psVar17,uVar18,(char *)0x0,(ulong)local_158);
          lVar5 = local_150;
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
          uVar18 = (uVar18 + lVar5) - 1;
        }
      }
      uVar18 = uVar18 + 1;
      uVar7 = psVar17->_M_string_length;
    } while (uVar18 < uVar7);
  }
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  pcVar3 = (psVar17->_M_dataplus)._M_p;
  paVar1 = &psVar17->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&psVar17->field_2 + 8);
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uVar4;
  }
  else {
    (local_38->_M_dataplus)._M_p = pcVar3;
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38->_M_string_length = uVar7;
  (psVar17->_M_dataplus)._M_p = (pointer)paVar1;
  psVar17->_M_string_length = 0;
  (psVar17->field_2)._M_local_buf[0] = '\0';
  return local_38;
}

Assistant:

inline std::string EscapeString(std::string str)
        {
            str = ReplaceAll(str, "\\", "\\\\");
            str = ReplaceAll(str, "\"", "\\\"");
            str = ReplaceAll(str, "/", "\\/");
            str = ReplaceAll(str, "\b", "\\b");
            str = ReplaceAll(str, "\n", "\\n");
            str = ReplaceAll(str, "\f", "\\f");
            str = ReplaceAll(str, "\r", "\\r");
            str = ReplaceAll(str, "\t", "\\t");

            //UTF-8 decoding.
            for(size_t i = 0; i < str.size(); i++)
            {
                int Bytes = IsUTF8(str[i]);
                if(Bytes)
                {
                    int FreeBits = UTF8BitShift(str[i]);
                    uint8_t Buf[sizeof(uint32_t)] = {0};
                    Buf[Bytes] = str[i] & (0xFF >> FreeBits);

                    size_t Counter = 0;

                    for (; Counter < Bytes; Counter++)
                    {
                        size_t Pos = i + Counter + 1;
                        if(Pos >= str.size())   //End of string?
                            break;

                        int ShiftBits = UTF8BitShift(str[Pos]);
                        if(ShiftBits != 2)  //All second Bytes needs to begin with 10xxxxxx, otherwise its not utf-8.
                            break;

                        uint8_t c = str[Pos] & (0xFF >> ShiftBits);
                        Buf[Bytes - (Counter + 1)] = c;
                    }

                    //We have valid UTF8
                    if(Counter == Bytes)
                    {
                        uint32_t UTF32 = 0;
                        uint8_t Shift = 6;

                        for(char i = 0; i < Bytes; i++)
                        {
                            //ä - xxx00011 xx100100
                            //𝄞 - xxxxx000 xx011101 xx000100 xx011110

                            //1 - << 6
                            //ä - xxx000xx 11100100
                            //xxx000xx >> 2 - xxxxx000 11100100
                            //End



                            //1 - << 6
                            //𝄞 - xxxxx000 xx011101 xx0001xx 00011110
                            //xx0001xx >> 2 - xxxxx000 xx011101 xxxx0001 00011110

                            //2 - << 4
                            //𝄞 - xxxxx000 xx01xxxx 11010001 00011110
                            //xx01xxxx >> 4 - xxxxx000 xxxxxx01 11010001 00011110

                            //3 - << 2
                            //𝄞 - xxxxxxxx xxx00001 11010001 00011110
                            //End

                            //i = xx100100

                            uint8_t Carry = (Buf[i + 1] & ((0x4 << i * 2) - 1));
        
                            UTF32 |= (Buf[i] | (Carry << Shift)) << (8 * i);
                            Buf[i + 1] >>= i * 2 + 2;

                            Shift -= 2;

                            // UTF32 |= (Buf[i] | ((Buf[i + 1] & ((0x4 << i * 2) - 1)) << ((Bytes + 1 - i) * 2))) << (8 * i);
                            // Buf[i + 1] >>= i * 2 + 2;
                        }

                        UTF32 |= Buf[Bytes] << (8 * Bytes);

                        std::string Encode = "\\u" + NumToHexStr(UTF32);
                        str.erase(i, Bytes + 1);
                        str.insert(i, Encode);
                        i += Encode.size() - 1;
                    }
                }
            }

            return str;
        }